

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void __thiscall dxil_spv::CFGStructurizer::duplicate_node(CFGStructurizer *this,CFGNode *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar1;
  pointer *ppIVar2;
  pointer *pppOVar3;
  uint32_t uVar4;
  Id id;
  pointer ppCVar5;
  CFGNode *this_00;
  pointer pcVar6;
  pointer pPVar7;
  pointer ppOVar8;
  iterator __position;
  pointer pIVar9;
  iterator __position_00;
  bool bVar10;
  Id IVar11;
  CFGNode *to_next;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *pbVar12;
  const_iterator cVar13;
  mapped_type *pmVar14;
  pointer pIVar15;
  CFGNode *to;
  long lVar16;
  pointer pIVar17;
  PHI *phi;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  pointer pPVar18;
  long lVar19;
  Vector<IncomingValue> *incoming;
  pointer ppOVar20;
  long lVar21;
  Vector<UnorderedMap<spv::Id,_spv::Id>_> rewritten_ids;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> __str;
  Vector<CFGNode_*> tmp_pred;
  Vector<CFGNode_*> break_blocks;
  undefined1 local_d0 [32];
  CFGNode *local_b0;
  vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  local_a8;
  long local_88;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_80;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_60;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_48;
  
  local_a8.
  super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppCVar5 = (node->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(node->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 != 8) {
    __assert_fail("node->succ.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x639,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
  }
  if ((ulong)((long)(node->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(node->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    __assert_fail("node->pred.size() >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x63a,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
  }
  bVar10 = CFGNode::dominates(node,*ppCVar5);
  if (bVar10) {
    __assert_fail("!node->dominates(node->succ.front())",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x63b,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
  }
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&local_48,
             (long)(node->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(node->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_d0);
  std::
  vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ::resize(&local_a8,
           (long)(node->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(node->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  to = *(node->succ).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&local_60,&node->pred);
  local_b0 = node;
  if ((long)local_60.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_60.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_88 = (long)local_60.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_60.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
    local_88 = local_88 + (ulong)(local_88 == 0);
    lVar16 = 0;
    do {
      this_00 = local_60.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar16];
      this_01 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)(local_a8.
                    super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16);
      to_next = CFGNodePool::create_node(this->pool);
      pcVar6 = (node->name)._M_dataplus._M_p;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                           *)&local_80,pcVar6,pcVar6 + (node->name)._M_string_length);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::append
                (&local_80,".dup.");
      pbVar12 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                _M_append(&local_80,(this_00->name)._M_dataplus._M_p,
                          (this_00->name)._M_string_length);
      local_d0._0_8_ = (pbVar12->_M_dataplus)._M_p;
      paVar1 = &pbVar12->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
           *)local_d0._0_8_ == paVar1) {
        local_d0._16_8_ = paVar1->_M_allocated_capacity;
        local_d0._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
        local_d0._0_8_ = (CFGNode *)(local_d0 + 0x10);
      }
      else {
        local_d0._16_8_ = paVar1->_M_allocated_capacity;
      }
      local_d0._8_8_ = pbVar12->_M_string_length;
      (pbVar12->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar12->_M_string_length = 0;
      (pbVar12->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&to_next->name,
                 (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_d0);
      if ((CFGNode *)local_d0._0_8_ != (CFGNode *)(local_d0 + 0x10)) {
        free_in_thread((void *)local_d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        free_in_thread(local_80._M_dataplus._M_p);
      }
      (to_next->ir).terminator.type = Branch;
      (to_next->ir).terminator.direct_block = to;
      to_next->immediate_post_dominator = to;
      to_next->immediate_dominator = this_00;
      CFGNode::retarget_branch(this_00,node,to_next);
      CFGNode::add_branch(to_next,to);
      pPVar18 = (node->ir).phi.
                super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar7 = (node->ir).phi.
               super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar18 != pPVar7) {
        incoming = &pPVar18->incoming;
        do {
          cVar13 = find_incoming_value(this_00,incoming);
          if (cVar13._M_current ==
              (incoming->
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("itr != phi.incoming.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                          ,0x655,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
          }
          uVar4 = (cVar13._M_current)->id;
          pmVar14 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](this_01,(key_type *)((long)(incoming + -1) + 8));
          *pmVar14 = uVar4;
          pPVar18 = (pointer)(incoming + 1);
          incoming = (Vector<IncomingValue> *)((long)(incoming + 1) + 0x10);
        } while (pPVar18 != pPVar7);
      }
      node = local_b0;
      ppOVar20 = (local_b0->ir).operations.
                 super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppOVar8 = *(pointer *)
                 ((long)&(local_b0->ir).operations.
                         super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      if (ppOVar20 != ppOVar8) {
        do {
          local_d0._0_8_ = duplicate_op(this,*ppOVar20,(UnorderedMap<spv::Id,_spv::Id> *)this_01);
          __position._M_current =
               (to_next->ir).operations.
               super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (to_next->ir).operations.
              super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>::
            _M_realloc_insert<dxil_spv::Operation*>
                      ((vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>
                        *)&(to_next->ir).operations,__position,(Operation **)local_d0);
          }
          else {
            *__position._M_current = (Operation *)local_d0._0_8_;
            pppOVar3 = &(to_next->ir).operations.
                        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppOVar3 = *pppOVar3 + 1;
          }
          ppOVar20 = ppOVar20 + 1;
        } while (ppOVar20 != ppOVar8);
      }
      local_48.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar16] = to_next;
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_88);
  }
  if ((node->pred).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (node->pred).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("node->pred.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x65f,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
  }
  do {
    while( true ) {
      if (to == (CFGNode *)0x0) {
        if (local_60.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          free_in_thread(local_60.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_48.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          free_in_thread(local_48.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_a8);
        return;
      }
      pPVar18 = (to->ir).phi.
                super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar7 = (to->ir).phi.
               super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar18 == pPVar7) break;
      bVar10 = false;
      do {
        pIVar17 = (pPVar18->incoming).
                  super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar9 = (pPVar18->incoming).
                 super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar16 = (long)pIVar9 - (long)pIVar17 >> 6;
        pIVar15 = pIVar17;
        if (0 < lVar16) {
          pIVar15 = (pointer)((long)&pIVar17->block +
                             ((long)pIVar9 - (long)pIVar17 & 0xffffffffffffffc0U));
          lVar16 = lVar16 + 1;
          pIVar17 = pIVar17 + 2;
          do {
            if (pIVar17[-2].block == node) {
              pIVar17 = pIVar17 + -2;
              goto LAB_00138769;
            }
            if (pIVar17[-1].block == node) {
              pIVar17 = pIVar17 + -1;
              goto LAB_00138769;
            }
            if (pIVar17->block == node) goto LAB_00138769;
            if (pIVar17[1].block == node) {
              pIVar17 = pIVar17 + 1;
              goto LAB_00138769;
            }
            lVar16 = lVar16 + -1;
            pIVar17 = pIVar17 + 4;
          } while (1 < lVar16);
        }
        lVar16 = (long)pIVar9 - (long)pIVar15 >> 4;
        if (lVar16 == 1) {
LAB_0013874d:
          pIVar17 = pIVar15;
          if (pIVar15->block != node) {
            pIVar17 = pIVar9;
          }
        }
        else if (lVar16 == 2) {
LAB_00138744:
          pIVar17 = pIVar15;
          if (pIVar15->block != node) {
            pIVar15 = pIVar15 + 1;
            goto LAB_0013874d;
          }
        }
        else {
          pIVar17 = pIVar9;
          if ((lVar16 == 3) && (pIVar17 = pIVar15, pIVar15->block != node)) {
            pIVar15 = pIVar15 + 1;
            goto LAB_00138744;
          }
        }
LAB_00138769:
        if (pIVar17 != pIVar9) {
          id = pIVar17->id;
          pIVar15 = pIVar17 + 1;
          if (pIVar15 != pIVar9) {
            memmove(pIVar17,pIVar15,(long)pIVar9 - (long)pIVar15);
          }
          ppIVar2 = &(pPVar18->incoming).
                     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar2 = *ppIVar2 + -1;
          bVar10 = true;
          if ((long)local_60.
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_60.
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0) {
            lVar19 = (long)local_60.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_60.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
            lVar21 = 0;
            lVar16 = 0;
            do {
              local_d0._0_8_ =
                   local_48.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16];
              IVar11 = get_remapped_id_for_duplicated_block
                                 (id,(UnorderedMap<spv::Id,_spv::Id> *)
                                     ((long)&((local_a8.
                                               super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->_M_h).
                                             _M_buckets + lVar21));
              local_d0._8_4_ = IVar11;
              __position_00._M_current =
                   (pPVar18->incoming).
                   super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (pPVar18->incoming).
                  super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                ::_M_realloc_insert<dxil_spv::IncomingValue>
                          (&pPVar18->incoming,__position_00,(IncomingValue *)local_d0);
              }
              else {
                (__position_00._M_current)->block = (CFGNode *)local_d0._0_8_;
                *(undefined8 *)&(__position_00._M_current)->id = local_d0._8_8_;
                ppIVar2 = &(pPVar18->incoming).
                           super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppIVar2 = *ppIVar2 + 1;
              }
              lVar16 = lVar16 + 1;
              lVar21 = lVar21 + 0x38;
              node = local_b0;
            } while (lVar19 + (ulong)(lVar19 == 0) != lVar16);
          }
        }
        pPVar18 = pPVar18 + 1;
      } while (pPVar18 != pPVar7);
      if (!bVar10) break;
LAB_0013884e:
      to = (CFGNode *)0x0;
    }
    ppCVar5 = (to->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(to->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 != 8) goto LAB_0013884e;
    to = *ppCVar5;
  } while( true );
}

Assistant:

void CFGStructurizer::duplicate_node(CFGNode *node)
{
	Vector<UnorderedMap<spv::Id, spv::Id>> rewritten_ids;
	assert(node->succ.size() == 1);
	assert(node->pred.size() >= 2);
	assert(!node->dominates(node->succ.front()));

	Vector<CFGNode *> break_blocks(node->pred.size());
	rewritten_ids.resize(node->pred.size());
	auto *succ = node->succ.front();

	auto tmp_pred = node->pred;
	for (size_t i = 0, n = tmp_pred.size(); i < n; i++)
	{
		auto *pred = tmp_pred[i];
		auto &remap = rewritten_ids[i];

		// First, rewrite PHI inputs.
		// Since we only have one pred now, we can resolve PHIs directly.
		auto *block = pool.create_node();
		block->name = node->name + ".dup." + pred->name;
		block->ir.terminator.type = Terminator::Type::Branch;
		block->ir.terminator.direct_block = succ;
		block->immediate_post_dominator = succ;
		block->immediate_dominator = pred;
		pred->retarget_branch(node, block);
		block->add_branch(succ);

		for (auto &phi : node->ir.phi)
		{
			auto itr = find_incoming_value(pred, phi.incoming);
			assert(itr != phi.incoming.end());
			remap[phi.id] = itr->id;
		}

		for (auto *op : node->ir.operations)
			block->ir.operations.push_back(duplicate_op(op, remap));

		break_blocks[i] = block;
	}

	assert(node->pred.empty());

	// Finally, look at succ. If it takes PHI inputs from node, we'll have to rewrite the PHIs.
	// We know that node does not dominate succ,
	// so succ cannot use any SSA variables node generated directly
	// without using PHI nodes.

	// We might have placed ladders in between so that we need to fixup PHI later than just plain succ.
	// Chase down the chain and replace all PHIs.

	while (succ)
	{
		bool done = false;
		for (auto &phi : succ->ir.phi)
		{
			// Find incoming ID from the block we're splitting up.
			auto incoming_itr = std::find_if(phi.incoming.begin(), phi.incoming.end(), [&](const IncomingValue &incoming) {
				return incoming.block == node;
			});

			if (incoming_itr != phi.incoming.end())
			{
				spv::Id incoming_from_node = incoming_itr->id;
				phi.incoming.erase(incoming_itr);

				for (size_t i = 0, n = tmp_pred.size(); i < n; i++)
				{
					auto &remap = rewritten_ids[i];
					phi.incoming.push_back({ break_blocks[i], get_remapped_id_for_duplicated_block(incoming_from_node, remap) });
				}

				// We've found the block we wanted to rewrite, terminate loop now.
				done = true;
			}
		}

		if (!done && succ->succ.size() == 1)
			succ = succ->succ.front();
		else
			succ = nullptr;
	}
}